

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

void __thiscall
icu_63::DateTimePatternGenerator::DateTimePatternGenerator
          (DateTimePatternGenerator *this,DateTimePatternGenerator *other)

{
  PtnSkeleton *pPVar1;
  FormatParser *this_00;
  DateTimeMatcher *pDVar2;
  DistanceInfo *pDVar3;
  PatternMap *this_01;
  long lVar4;
  DateTimePatternGenerator *size;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateTimePatternGenerator_004637c8;
  size = other;
  Locale::Locale(&this->pLocale);
  lVar4 = 0;
  do {
    *(undefined ***)(&this->field_0x108 + lVar4) = &PTR__UnicodeString_00471e80;
    *(undefined2 *)(&this->field_0x110 + lVar4) = 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x400);
  lVar4 = 0;
  do {
    *(undefined ***)(&this->field_0x508 + lVar4) = &PTR__UnicodeString_00471e80;
    *(undefined2 *)(&this->field_0x510 + lVar4) = 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0xc00);
  (this->dateTimeFormat).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (this->dateTimeFormat).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->decimal).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (this->decimal).fUnion.fStackFields.fLengthAndFlags = 2;
  this->skipMatcher = (DateTimeMatcher *)0x0;
  this->fAvailableFormatKeyHash = (Hashtable *)0x0;
  (this->emptyString).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (this->emptyString).fUnion.fStackFields.fLengthAndFlags = 2;
  this->internalErrorCode = U_ZERO_ERROR;
  this_00 = (FormatParser *)UMemory::operator_new((UMemory *)0xc90,(size_t)size);
  if (this_00 != (FormatParser *)0x0) {
    FormatParser::FormatParser(this_00);
  }
  this->fp = this_00;
  pDVar2 = (DateTimeMatcher *)UMemory::operator_new((UMemory *)0x98,(size_t)size);
  if (pDVar2 != (DateTimeMatcher *)0x0) {
    pDVar2->_vptr_DateTimeMatcher = (_func_int **)&PTR__DateTimeMatcher_00463840;
    (pDVar2->skeleton)._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_004638a8;
    (pDVar2->skeleton).original.chars[0] = '\0';
    (pDVar2->skeleton).original.chars[1] = '\0';
    (pDVar2->skeleton).original.chars[2] = '\0';
    (pDVar2->skeleton).original.chars[3] = '\0';
    (pDVar2->skeleton).original.chars[4] = '\0';
    (pDVar2->skeleton).original.chars[5] = '\0';
    (pDVar2->skeleton).original.chars[6] = '\0';
    (pDVar2->skeleton).original.chars[7] = '\0';
    pPVar1 = &pDVar2->skeleton;
    (pPVar1->original).chars[8] = '\0';
    (pPVar1->original).chars[9] = '\0';
    (pPVar1->original).chars[10] = '\0';
    (pPVar1->original).chars[0xb] = '\0';
    (pPVar1->original).chars[0xc] = '\0';
    (pPVar1->original).chars[0xd] = '\0';
    (pPVar1->original).chars[0xe] = '\0';
    (pPVar1->original).chars[0xf] = '\0';
    (pDVar2->skeleton).original.lengths[0] = '\0';
    (pDVar2->skeleton).original.lengths[1] = '\0';
    (pDVar2->skeleton).original.lengths[2] = '\0';
    (pDVar2->skeleton).original.lengths[3] = '\0';
    (pDVar2->skeleton).original.lengths[4] = '\0';
    (pDVar2->skeleton).original.lengths[5] = '\0';
    (pDVar2->skeleton).original.lengths[6] = '\0';
    (pDVar2->skeleton).original.lengths[7] = '\0';
    pPVar1 = &pDVar2->skeleton;
    (pPVar1->original).lengths[8] = '\0';
    (pPVar1->original).lengths[9] = '\0';
    (pPVar1->original).lengths[10] = '\0';
    (pPVar1->original).lengths[0xb] = '\0';
    (pPVar1->original).lengths[0xc] = '\0';
    (pPVar1->original).lengths[0xd] = '\0';
    (pPVar1->original).lengths[0xe] = '\0';
    (pPVar1->original).lengths[0xf] = '\0';
    (pDVar2->skeleton).baseOriginal.chars[0] = '\0';
    (pDVar2->skeleton).baseOriginal.chars[1] = '\0';
    (pDVar2->skeleton).baseOriginal.chars[2] = '\0';
    (pDVar2->skeleton).baseOriginal.chars[3] = '\0';
    (pDVar2->skeleton).baseOriginal.chars[4] = '\0';
    (pDVar2->skeleton).baseOriginal.chars[5] = '\0';
    (pDVar2->skeleton).baseOriginal.chars[6] = '\0';
    (pDVar2->skeleton).baseOriginal.chars[7] = '\0';
    pPVar1 = &pDVar2->skeleton;
    (pPVar1->baseOriginal).chars[8] = '\0';
    (pPVar1->baseOriginal).chars[9] = '\0';
    (pPVar1->baseOriginal).chars[10] = '\0';
    (pPVar1->baseOriginal).chars[0xb] = '\0';
    (pPVar1->baseOriginal).chars[0xc] = '\0';
    (pPVar1->baseOriginal).chars[0xd] = '\0';
    (pPVar1->baseOriginal).chars[0xe] = '\0';
    (pPVar1->baseOriginal).chars[0xf] = '\0';
    (pDVar2->skeleton).baseOriginal.lengths[0] = '\0';
    (pDVar2->skeleton).baseOriginal.lengths[1] = '\0';
    (pDVar2->skeleton).baseOriginal.lengths[2] = '\0';
    (pDVar2->skeleton).baseOriginal.lengths[3] = '\0';
    (pDVar2->skeleton).baseOriginal.lengths[4] = '\0';
    (pDVar2->skeleton).baseOriginal.lengths[5] = '\0';
    (pDVar2->skeleton).baseOriginal.lengths[6] = '\0';
    (pDVar2->skeleton).baseOriginal.lengths[7] = '\0';
    pPVar1 = &pDVar2->skeleton;
    (pPVar1->baseOriginal).lengths[8] = '\0';
    (pPVar1->baseOriginal).lengths[9] = '\0';
    (pPVar1->baseOriginal).lengths[10] = '\0';
    (pPVar1->baseOriginal).lengths[0xb] = '\0';
    (pPVar1->baseOriginal).lengths[0xc] = '\0';
    (pPVar1->baseOriginal).lengths[0xd] = '\0';
    (pPVar1->baseOriginal).lengths[0xe] = '\0';
    (pPVar1->baseOriginal).lengths[0xf] = '\0';
  }
  this->dtMatcher = pDVar2;
  pDVar3 = (DistanceInfo *)UMemory::operator_new((UMemory *)0x10,(size_t)size);
  if (pDVar3 != (DistanceInfo *)0x0) {
    pDVar3->_vptr_DistanceInfo = (_func_int **)&PTR__DistanceInfo_004639b8;
  }
  this->distanceInfo = pDVar3;
  this_01 = (PatternMap *)UMemory::operator_new((UMemory *)0x1b0,(size_t)size);
  if (this_01 != (PatternMap *)0x0) {
    PatternMap::PatternMap(this_01);
  }
  this->patternMap = this_01;
  if ((((this_01 == (PatternMap *)0x0) || (this->fp == (FormatParser *)0x0)) ||
      (this->dtMatcher == (DateTimeMatcher *)0x0)) || (this->distanceInfo == (DistanceInfo *)0x0)) {
    this->internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  operator=(this,other);
  return;
}

Assistant:

DateTimePatternGenerator::DateTimePatternGenerator(const DateTimePatternGenerator& other) :
    UObject(),
    skipMatcher(nullptr),
    fAvailableFormatKeyHash(nullptr),
    internalErrorCode(U_ZERO_ERROR)
{
    fp = new FormatParser();
    dtMatcher = new DateTimeMatcher();
    distanceInfo = new DistanceInfo();
    patternMap = new PatternMap();
    if (fp == nullptr || dtMatcher == nullptr || distanceInfo == nullptr || patternMap == nullptr) {
        internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    *this=other;
}